

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::SetupProperties(MDLImporter *this,Importer *pImp)

{
  Importer *this_00;
  bool bVar1;
  uint uVar2;
  allocator<char> local_59;
  string local_58;
  string local_38;
  Importer *local_18;
  Importer *pImp_local;
  MDLImporter *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  uVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_KEYFRAME",-1);
  this->configFrameID = uVar2;
  if (this->configFrameID == 0xffffffff) {
    uVar2 = Importer::GetPropertyInteger(local_18,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar2;
  }
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"colormap.lmp",&local_59);
  Importer::GetPropertyString(&local_38,this_00,"IMPORT_MDL_COLORMAP",&local_58);
  std::__cxx11::string::operator=((string *)&this->configPalette,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_MDL_HL1_READ_ANIMATIONS",true);
  (this->mHL1ImportSettings).read_animations = bVar1;
  if (((this->mHL1ImportSettings).read_animations & 1U) != 0) {
    bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_MDL_HL1_READ_ANIMATION_EVENTS",true);
    (this->mHL1ImportSettings).read_animation_events = bVar1;
    bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_MDL_HL1_READ_BLEND_CONTROLLERS",true);
    (this->mHL1ImportSettings).read_blend_controllers = bVar1;
    bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_MDL_HL1_READ_SEQUENCE_TRANSITIONS",true);
    (this->mHL1ImportSettings).read_sequence_transitions = bVar1;
  }
  bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_MDL_HL1_READ_ATTACHMENTS",true);
  (this->mHL1ImportSettings).read_attachments = bVar1;
  bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_MDL_HL1_READ_BONE_CONTROLLERS",true);
  (this->mHL1ImportSettings).read_bone_controllers = bVar1;
  bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_MDL_HL1_READ_HITBOXES",true);
  (this->mHL1ImportSettings).read_hitboxes = bVar1;
  bVar1 = Importer::GetPropertyBool(local_18,"IMPORT_MDL_HL1_READ_MISC_GLOBAL_INFO",true);
  (this->mHL1ImportSettings).read_misc_global_info = bVar1;
  return;
}

Assistant:

void MDLImporter::SetupProperties(const Importer* pImp)
{
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_MDL_KEYFRAME,-1);

    // The
    // AI_CONFIG_IMPORT_MDL_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    if(static_cast<unsigned int>(-1) == configFrameID)  {
        configFrameID =  pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }

    // AI_CONFIG_IMPORT_MDL_COLORMAP - palette file
    configPalette =  pImp->GetPropertyString(AI_CONFIG_IMPORT_MDL_COLORMAP,"colormap.lmp");

    // Read configuration specific to MDL (Half-Life 1).
    mHL1ImportSettings.read_animations = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_ANIMATIONS, true);
    if (mHL1ImportSettings.read_animations) {
        mHL1ImportSettings.read_animation_events = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_ANIMATION_EVENTS, true);
        mHL1ImportSettings.read_blend_controllers = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_BLEND_CONTROLLERS, true);
        mHL1ImportSettings.read_sequence_transitions = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_SEQUENCE_TRANSITIONS, true);
    }
    mHL1ImportSettings.read_attachments = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_ATTACHMENTS, true);
    mHL1ImportSettings.read_bone_controllers = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_BONE_CONTROLLERS, true);
    mHL1ImportSettings.read_hitboxes = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_HITBOXES, true);
    mHL1ImportSettings.read_misc_global_info = pImp->GetPropertyBool(AI_CONFIG_IMPORT_MDL_HL1_READ_MISC_GLOBAL_INFO, true);
}